

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_tuple.hpp
# Opt level: O2

named_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385192550UL>_>),_int_(named_types::named_tag<std::integral_constant<unsigned_long,_193490482UL>_>),_double_(named_types::named_tag<std::integral_constant<unsigned_long,_6385206976UL>_>),_std::vector<int,_std::allocator<int>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385738401UL>_>)>
* __thiscall
named_types::
make_named_tuple<named_types::__attribute_value_holder<std::integral_constant<unsigned_long,6385192550ul>,std::__cxx11::string>,named_types::__attribute_value_holder<std::integral_constant<unsigned_long,193490482ul>,int>,named_types::__attribute_value_holder<std::integral_constant<unsigned_long,6385206976ul>,double>,named_types::__attribute_value_holder<std::integral_constant<unsigned_long,6385738401ul>,std::vector<int,std::allocator<int>>>>
          (named_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385192550UL>_>),_int_(named_types::named_tag<std::integral_constant<unsigned_long,_193490482UL>_>),_double_(named_types::named_tag<std::integral_constant<unsigned_long,_6385206976UL>_>),_std::vector<int,_std::allocator<int>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385738401UL>_>)>
           *__return_storage_ptr__,named_types *this,
          __attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args,__attribute_value_holder<std::integral_constant<unsigned_long,_193490482UL>,_int>
                *args_1,
          __attribute_value_holder<std::integral_constant<unsigned_long,_6385206976UL>,_double>
          *args_2,__attribute_value_holder<std::integral_constant<unsigned_long,_6385738401UL>,_std::vector<int,_std::allocator<int>_>_>
                  *args_3)

{
  double *pdVar1;
  int local_74;
  double local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(&local_48,
        (__attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)this);
  local_74 = *(int *)&(args->value_->_M_dataplus)._M_p;
  local_70 = *(double *)args_1->value_;
  pdVar1 = args_2->value_;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)*pdVar1;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)pdVar1[1];
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pdVar1[2];
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  pdVar1[2] = 0.0;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_std::vector<int,_std::allocator<int>_>_>
  ::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_std::vector<int,_std::allocator<int>_>,_true,_true>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_std::vector<int,_std::allocator<int>_>_>
              *)__return_storage_ptr__,&local_48,&local_74,&local_70,
             (vector<int,_std::allocator<int>_> *)&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline constexpr decltype(auto) make_named_tuple(Types&&... args) {
  return named_tuple<typename Types::tag_func_notation...>(
      std::move(args).get()...);
}